

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O2

Color * __thiscall
RayTracer::m_calcLocalIllumination
          (Color *__return_storage_ptr__,RayTracer *this,Collision *coll,Material *material)

{
  Light *pLVar1;
  double dVar2;
  double dVar3;
  pointer ppLVar4;
  Scene *pSVar5;
  Vector3 *B;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Vector3 l;
  Color color;
  Vector3 r;
  Color local_d8;
  Vector3 *local_c0;
  double local_b8;
  Color local_b0;
  Color local_98;
  Vector3 local_80;
  Color local_68;
  Color local_48;
  
  local_c0 = &coll->n;
  Vector3::reflect(&local_80,&coll->ray_dir,local_c0);
  B = &coll->p;
  (*coll->object->_vptr_Object[3])(&local_b0,coll->object,B);
  operator*(&material->color,&local_b0);
  pSVar5 = this->m_scene;
  local_68.b = (pSVar5->m_ambient_color).b;
  local_68.r = (pSVar5->m_ambient_color).r;
  local_68.g = (pSVar5->m_ambient_color).g;
  operator*(&local_98,&local_68);
  Color::operator*(__return_storage_ptr__,&local_b0,material->diff);
  pSVar5 = this->m_scene;
  for (ppLVar4 = (pSVar5->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppLVar4 !=
      (pSVar5->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppLVar4 = ppLVar4 + 1) {
    (*(*ppLVar4)->_vptr_Light[4])(*ppLVar4,pSVar5,B);
    if (1e-06 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
      (*(*ppLVar4)->_vptr_Light[2])(&local_48);
      operator-((Vector3 *)&local_48,B);
      Vector3::unitize((Vector3 *)&local_68);
      if (1e-06 < material->diff) {
        pLVar1 = *ppLVar4;
        local_d8.b = (pLVar1->m_color).b;
        local_d8.r = (pLVar1->m_color).r;
        local_d8.g = (pLVar1->m_color).g;
        operator*(&local_98,&local_d8);
        local_b8 = material->diff;
        dVar2 = Vector3::dot((Vector3 *)&local_b0,local_c0);
        Color::operator*(&local_68,&local_48,
                         dVar2 * local_b8 * (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        Color::operator+=(__return_storage_ptr__,&local_68);
      }
      if (1e-06 < material->spec) {
        pLVar1 = *ppLVar4;
        local_d8.b = (pLVar1->m_color).b;
        local_d8.r = (pLVar1->m_color).r;
        local_d8.g = (pLVar1->m_color).g;
        operator*(&local_98,&local_d8);
        dVar2 = material->spec;
        dVar3 = Vector3::dot((Vector3 *)&local_b0,&local_80);
        dVar3 = pow(dVar3,50.0);
        Color::operator*(&local_68,&local_48,dVar3 * dVar2);
        Color::operator+=(__return_storage_ptr__,&local_68);
      }
    }
    pSVar5 = this->m_scene;
  }
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_calcLocalIllumination(const Collision& coll, const Material* material) const
{
    Vector3 r = coll.ray_dir.reflect(coll.n);
    Color color = material->color * coll.object->getTextureColor(coll.p);
    Color ret = color * m_scene->getAmbientLightColor() * material->diff; // 环境光
    for (auto light = m_scene->lightsBegin(); light != m_scene->lightsEnd(); light++)
    {
        double shade = (*light)->getShadowRatio(m_scene, coll.p);
        if (shade < Const::EPS) continue;

        Vector3 l = ((*light)->getSource() - coll.p).unitize();
        if (material->diff > Const::EPS) // 漫反射
            ret += color * (*light)->getColor() * (material->diff * l.dot(coll.n) * shade);
        if (material->spec > Const::EPS) // 镜面反射
            ret += color * (*light)->getColor() * (material->spec * pow(l.dot(r), SPEC_POWER));
    }
    return ret;
}